

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char in_whitespace)

{
  long lVar1;
  jessilib *pjVar2;
  jessilib jVar3;
  jessilib *pjVar4;
  size_t sVar5;
  jessilib *pjVar6;
  jessilib *pjVar7;
  
  jVar3 = SUB81(end,0);
  if (begin <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  do {
    pjVar4 = this;
    if (*this != jVar3) break;
    this = this + 1;
    pjVar4 = (jessilib *)begin;
  } while (this != (jessilib *)begin);
  if (pjVar4 != (jessilib *)begin) {
    sVar5 = 0;
    do {
      if (pjVar4[sVar5] == jVar3) {
        pjVar2 = pjVar4 + sVar5 + 1;
        goto LAB_00111cec;
      }
      lVar1 = sVar5 + 1;
      sVar5 = sVar5 + 1;
    } while (pjVar4 + lVar1 != (jessilib *)begin);
  }
  (__return_storage_ptr__->first)._M_len = (long)begin - (long)pjVar4;
  (__return_storage_ptr__->first)._M_str = (char *)pjVar4;
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char *)0x0;
  return __return_storage_ptr__;
  while (pjVar2 = pjVar6 + 1, pjVar7 = pjVar6, *pjVar6 == jVar3) {
LAB_00111cec:
    pjVar6 = pjVar2;
    pjVar7 = (jessilib *)begin;
    if (pjVar6 == (jessilib *)begin) break;
  }
  (__return_storage_ptr__->first)._M_len = sVar5;
  (__return_storage_ptr__->first)._M_str = (char *)pjVar4;
  (__return_storage_ptr__->second)._M_len = (long)begin - (long)pjVar7;
  (__return_storage_ptr__->second)._M_str = (char *)pjVar7;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}